

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::prim::print_prim_abi_cxx11_
          (string *__return_storage_ptr__,prim *this,Prim *prim,uint32_t indent)

{
  long lVar1;
  pointer pTVar2;
  int iVar3;
  Prim *this_00;
  string *psVar4;
  ostream *poVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  iterator iVar8;
  PrimMeta *pPVar9;
  pointer pPVar10;
  size_type *psVar11;
  Prim *pPVar12;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_00;
  uint32_t uVar13;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  prim *extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar14;
  prim *ppVar15;
  uint uVar16;
  _Rb_tree_node_base *p_Var17;
  undefined1 in_R8B;
  ulong uVar18;
  pprint *v;
  long lVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  string s;
  stringstream ss;
  undefined1 local_2b0 [32];
  _Base_ptr local_290;
  size_t local_288;
  string local_280;
  uint local_25c;
  Prim *local_258;
  string local_250;
  uint local_22c;
  long *local_228;
  long local_220;
  long local_218 [2];
  pprint *local_208;
  uint local_1fc;
  string *local_1f8;
  prim *local_1f0;
  _Rb_tree_node_base *local_1e8;
  _Base_ptr *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  v = (pprint *)((ulong)prim & 0xffffffff);
  std::__cxx11::stringstream::stringstream(local_1b8);
  tinyusdz::value::pprint_value_abi_cxx11_
            (&local_1d8,(value *)(this + 0x298),(Value *)v,0,(bool)in_R8B);
  bVar20 = true;
  if ((2 < local_1d8._M_string_length) &&
     (local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 2] == '{')) {
    bVar20 = local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 1] != '\n';
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  ppVar15 = extraout_RDX;
  local_258 = (Prim *)this;
  local_208 = v;
  local_1f8 = __return_storage_ptr__;
  if (*(long *)(this + 0x348) != 0) {
    if (bVar20) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    ppVar15 = *(prim **)(this + 0x338);
    auVar22._8_8_ = ppVar15;
    auVar22._0_8_ = ppVar15;
    local_1f0 = this + 0x328;
    bVar20 = true;
    if (ppVar15 != local_1f0) {
      iVar3 = (int)prim;
      uVar16 = iVar3 + 1;
      local_25c = iVar3 + 2;
      local_22c = iVar3 + 3;
      local_1fc = uVar16;
      do {
        p_Var17 = auVar22._0_8_;
        pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)uVar16,auVar22._8_4_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"variantSet ",0xb);
        local_228 = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"\"","");
        local_2b0._0_8_ = local_2b0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b0,local_228,local_220 + (long)local_228);
        std::__cxx11::string::_M_append((char *)local_2b0,*(ulong *)(p_Var17 + 1));
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_2b0,(ulong)local_228);
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_280.field_2._M_allocated_capacity = *psVar11;
          local_280.field_2._8_8_ = plVar6[3];
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar11;
          local_280._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_280._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_280._M_dataplus._M_p,local_280._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = {\n",5);
        uVar14 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_RDX_01;
        }
        if (local_228 != local_218) {
          operator_delete(local_228,local_218[0] + 1);
          uVar14 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          uVar14 = extraout_RDX_03;
        }
        uVar13 = (uint32_t)uVar14;
        auVar21._8_8_ = uVar14;
        auVar21._0_8_ = p_Var17[3]._M_right;
        local_1e0 = &p_Var17[3]._M_parent;
        local_1e8 = p_Var17;
        if (p_Var17[3]._M_right != (_Base_ptr)local_1e0) {
          do {
            p_Var17 = auVar21._0_8_;
            pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_25c,auVar21._8_4_);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
            local_228 = local_218;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"\"","");
            local_2b0._0_8_ = local_2b0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2b0,local_228,local_220 + (long)local_228);
            std::__cxx11::string::_M_append((char *)local_2b0,*(ulong *)(p_Var17 + 1));
            plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_2b0,(ulong)local_228);
            uVar16 = local_22c;
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            psVar11 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_280.field_2._M_allocated_capacity = *psVar11;
              local_280.field_2._8_8_ = plVar6[3];
            }
            else {
              local_280.field_2._M_allocated_capacity = *psVar11;
              local_280._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_280._M_string_length = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,local_280._M_dataplus._M_p,local_280._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_228 != local_218) {
              operator_delete(local_228,local_218[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            bVar20 = PrimMetas::authored((PrimMetas *)&p_Var17[3]._M_left);
            if (bVar20) {
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
              print_prim_metas_abi_cxx11_
                        ((string *)local_2b0,(tinyusdz *)&p_Var17[3]._M_left,
                         (PrimMeta *)(ulong)uVar16,(uint32_t)psVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_2b0._0_8_,
                         CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
              uVar13 = extraout_EDX;
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
                uVar13 = extraout_EDX_00;
              }
              pprint::Indent_abi_cxx11_((string *)local_2b0,(pprint *)(ulong)local_25c,uVar13);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,(char *)local_2b0._0_8_,
                                  CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
              if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8," {\n",3);
            print_props((string *)local_2b0,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)(p_Var17 + 2),uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_2b0._0_8_,CONCAT44(local_2b0._12_4_,local_2b0._8_4_))
            ;
            uVar13 = extraout_EDX_01;
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
              uVar13 = extraout_EDX_02;
            }
            if ((*(char *)&p_Var17[0x21]._M_parent == '\x01') &&
               (psVar11 = (size_type *)
                          (((long)p_Var17[0x23]._M_left - (long)p_Var17[0x23]._M_parent >> 4) *
                          0x21cfb2b78c13521d),
               (size_type *)((long)p_Var17[0x21]._M_right - (long)p_Var17[0x21]._M_left >> 5) ==
               psVar11)) {
              local_2b0._8_4_ = _S_red;
              local_2b0._16_8_ = (_Link_type)0x0;
              local_2b0._24_8_ = local_2b0 + 8;
              local_288 = 0;
              p_Var7 = p_Var17[0x23]._M_parent;
              local_290 = (_Base_ptr)local_2b0._24_8_;
              if (p_Var17[0x23]._M_left != p_Var7) {
                lVar19 = 0;
                uVar18 = 0;
                do {
                  local_250._M_dataplus._M_p = (pointer)((long)&p_Var7->_M_color + lVar19);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                              *)local_2b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&p_Var7[0xd]._M_color + lVar19),(Prim **)&local_250);
                  uVar18 = uVar18 + 1;
                  p_Var7 = p_Var17[0x23]._M_parent;
                  lVar19 = lVar19 + 0x350;
                } while (uVar18 < (ulong)(((long)p_Var17[0x23]._M_left - (long)p_Var7 >> 4) *
                                         0x21cfb2b78c13521d));
              }
              uVar16 = local_22c;
              if (*(char *)&p_Var17[0x21]._M_parent != '\x01') {
LAB_00160049:
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x584,
                              "const value_type &nonstd::optional_lite::optional<std::vector<tinyusdz::Token>>::value() const [T = std::vector<tinyusdz::Token>]"
                             );
              }
              lVar19 = 8;
              uVar18 = 0;
              while (p_Var7 = p_Var17[0x21]._M_left,
                    uVar18 < (ulong)((long)p_Var17[0x21]._M_right - (long)p_Var7 >> 5)) {
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                lVar1 = *(long *)((long)p_Var7 + lVar19 + -8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_250,lVar1,
                           *(long *)((long)&p_Var7->_M_color + lVar19) + lVar1);
                iVar8 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                                *)local_2b0,&local_250);
                if (iVar8._M_node != (_Base_ptr)(local_2b0 + 8)) {
                  print_prim_abi_cxx11_
                            (&local_280,*(prim **)(iVar8._M_node + 2),(Prim *)(ulong)uVar16,
                             (uint32_t)(_Base_ptr)(local_2b0 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._M_dataplus._M_p != &local_280.field_2) {
                    operator_delete(local_280._M_dataplus._M_p,
                                    local_280.field_2._M_allocated_capacity + 1);
                  }
                  if (uVar18 != ((long)p_Var17[0x23]._M_left - (long)p_Var17[0x23]._M_parent >> 4) *
                                0x21cfb2b78c13521d - 1U) {
                    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_dataplus._M_p != &local_250.field_2) {
                  operator_delete(local_250._M_dataplus._M_p,
                                  local_250.field_2._M_allocated_capacity + 1);
                }
                uVar18 = uVar18 + 1;
                lVar19 = lVar19 + 0x20;
                if (*(char *)&p_Var17[0x21]._M_parent == '\0') goto LAB_00160049;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                          *)local_2b0,(_Link_type)local_2b0._16_8_);
              uVar13 = extraout_EDX_06;
            }
            else {
              p_Var7 = p_Var17[0x23]._M_parent;
              if (p_Var17[0x23]._M_left != p_Var7) {
                lVar19 = 0;
                uVar18 = 0;
                do {
                  print_prim_abi_cxx11_
                            ((string *)local_2b0,(prim *)((long)&p_Var7->_M_color + lVar19),
                             (Prim *)(ulong)uVar16,(uint32_t)psVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,(char *)local_2b0._0_8_,
                             CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
                  uVar13 = extraout_EDX_03;
                  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
                    uVar13 = extraout_EDX_04;
                  }
                  if (uVar18 != ((long)p_Var17[0x23]._M_left - (long)p_Var17[0x23]._M_parent >> 4) *
                                0x21cfb2b78c13521d - 1U) {
                    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
                    uVar13 = extraout_EDX_05;
                  }
                  uVar18 = uVar18 + 1;
                  p_Var7 = p_Var17[0x23]._M_parent;
                  lVar19 = lVar19 + 0x350;
                } while (uVar18 < (ulong)(((long)p_Var17[0x23]._M_left - (long)p_Var7 >> 4) *
                                         0x21cfb2b78c13521d));
              }
            }
            pprint::Indent_abi_cxx11_((string *)local_2b0,(pprint *)(ulong)local_25c,uVar13);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_2b0._0_8_,
                                CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
            }
            auVar21 = std::_Rb_tree_increment(p_Var17);
            uVar13 = auVar21._8_4_;
          } while ((_Base_ptr *)auVar21._0_8_ != local_1e0);
        }
        uVar16 = local_1fc;
        pprint::Indent_abi_cxx11_((string *)local_2b0,(pprint *)(ulong)local_1fc,uVar13);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_2b0._0_8_,
                            CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
        }
        auVar22 = std::_Rb_tree_increment(local_1e8);
        ppVar15 = auVar22._8_8_;
      } while (auVar22._0_8_ != local_1f0);
      bVar20 = true;
      this = (prim *)local_258;
    }
  }
  uVar13 = (uint32_t)ppVar15;
  if ((((Prim *)this)->_children).
      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (((Prim *)this)->_children).
      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (bVar20) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    this_00 = local_258;
    pPVar9 = Prim::metas(local_258);
    pPVar12 = (Prim *)((long)(pPVar9->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar9->primChildren).
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5);
    if (pPVar12 ==
        (Prim *)(((long)(this_00->_children).
                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this_00->_children).
                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d)) {
      local_2b0._24_8_ = local_2b0 + 8;
      local_2b0._8_4_ = _S_red;
      local_2b0._16_8_ = (_Link_type)0x0;
      local_288 = 0;
      pPVar10 = (this_00->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_290 = (_Base_ptr)local_2b0._24_8_;
      if ((this_00->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_finish != pPVar10) {
        lVar19 = 0;
        uVar18 = 0;
        do {
          local_250._M_dataplus._M_p =
               (pointer)((long)&(pPVar10->_abs_path)._prim_part._M_dataplus._M_p + lVar19);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                      *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pPVar10->_elementPath)._prim_part._M_dataplus._M_p + lVar19),
                     (Prim **)&local_250);
          uVar18 = uVar18 + 1;
          pPVar10 = (this_00->_children).
                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar19 = lVar19 + 0x350;
        } while (uVar18 < (ulong)(((long)(this_00->_children).
                                         super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar10
                                  >> 4) * 0x21cfb2b78c13521d));
      }
      pPVar9 = Prim::metas(this_00);
      if ((pPVar9->primChildren).
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pPVar9->primChildren).
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar3 = (int)local_208;
        lVar19 = 8;
        uVar18 = 0;
        do {
          if (uVar18 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          }
          pPVar9 = Prim::metas(local_258);
          pTVar2 = (pPVar9->primChildren).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar1 = *(long *)((long)pTVar2 + lVar19 + -8);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,lVar1,
                     *(long *)((long)&(pTVar2->str_)._M_dataplus._M_p + lVar19) + lVar1);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                          *)local_2b0,&local_250);
          if (iVar8._M_node != (_Base_ptr)(local_2b0 + 8)) {
            print_prim_abi_cxx11_
                      (&local_280,*(prim **)(iVar8._M_node + 2),(Prim *)(ulong)(iVar3 + 1),
                       (uint32_t)(_Base_ptr)(local_2b0 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          uVar18 = uVar18 + 1;
          pPVar9 = Prim::metas(local_258);
          lVar19 = lVar19 + 0x20;
        } while (uVar18 < (ulong)((long)(pPVar9->primChildren).
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pPVar9->primChildren).
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  *)local_2b0,(_Link_type)local_2b0._16_8_);
      uVar13 = extraout_EDX_08;
    }
    else {
      uVar13 = extraout_EDX_07;
      if ((this_00->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this_00->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        iVar3 = (int)local_208;
        lVar19 = 0;
        uVar18 = 0;
        do {
          uVar13 = (uint32_t)pPVar12;
          if (uVar18 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          }
          print_prim_abi_cxx11_
                    ((string *)local_2b0,
                     (prim *)((long)&(((local_258->_children).
                                       super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_abs_path).
                                     _prim_part + lVar19),(Prim *)(ulong)(iVar3 + 1),uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_2b0._0_8_,CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
          uVar13 = extraout_EDX_09;
          if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
            uVar13 = extraout_EDX_10;
          }
          uVar18 = uVar18 + 1;
          lVar19 = lVar19 + 0x350;
          pPVar12 = local_258;
        } while (uVar18 < (ulong)(((long)(local_258->_children).
                                         super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_258->_children).
                                         super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 0x21cfb2b78c13521d));
      }
    }
  }
  pprint::Indent_abi_cxx11_((string *)local_2b0,local_208,uVar13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_2b0._0_8_,CONCAT44(local_2b0._12_4_,local_2b0._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
  }
  psVar4 = local_1f8;
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_prim(const Prim &prim, const uint32_t indent) {
  std::stringstream ss;

  // Currently, Prim's elementName is read from name variable in concrete Prim
  // class(e.g. Xform::name).
  // TODO: use prim.elementPath for elementName.
  std::string s = pprint_value(prim.data(), indent, /* closing_brace */ false);

  bool require_newline = true;

  // Check last 2 chars.
  // if it ends with '{\n', no properties are authored so do not emit blank line
  // before printing VariantSet or child Prims.
  if (s.size() > 2) {
    if ((s[s.size() - 2] == '{') && (s[s.size() - 1] == '\n')) {
      require_newline = false;
    }
  }

  ss << s;

  //
  // print variant
  //
  if (prim.variantSets().size()) {
    if (require_newline) {
      ss << "\n";
    }

    // need to add blank line after VariantSet stmt and before child Prims,
    // so set require_newline true
    require_newline = true;

    for (const auto &variantSet : prim.variantSets()) {
      ss << pprint::Indent(indent + 1) << "variantSet "
         << quote(variantSet.first) << " = {\n";

      for (const auto &variantItem : variantSet.second.variantSet) {
        ss << pprint::Indent(indent + 2) << quote(variantItem.first);

        const Variant &variant = variantItem.second;

        if (variant.metas().authored()) {
          ss << " (\n";
          ss << print_prim_metas(variant.metas(), indent + 3);
          ss << pprint::Indent(indent + 2) << ")";
        }

        ss << " {\n";

        ss << print_props(variant.properties(), indent + 3);

        if (variant.metas().variantChildren.has_value() &&
            (variant.metas().variantChildren.value().size() ==
             variant.primChildren().size())) {
          std::map<std::string, const Prim *> primNameTable;
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            primNameTable.emplace(variant.primChildren()[i].element_name(),
                                  &variant.primChildren()[i]);
          }

          for (size_t i = 0; i < variant.metas().variantChildren.value().size();
               i++) {
            value::token nameTok = variant.metas().variantChildren.value()[i];
            const auto it = primNameTable.find(nameTok.str());
            if (it != primNameTable.end()) {
              ss << print_prim(*(it->second), indent + 3);
              if (i != (variant.primChildren().size() - 1)) {
                ss << "\n";
              }
            } else {
              // TODO: Report warning?
            }
          }

        } else {
          for (size_t i = 0; i < variant.primChildren().size(); i++) {
            ss << print_prim(variant.primChildren()[i], indent + 3);
            if (i != (variant.primChildren().size() - 1)) {
              ss << "\n";
            }
          }
        }

        ss << pprint::Indent(indent + 2) << "}\n";
      }

      ss << pprint::Indent(indent + 1) << "}\n";
    }
  }

  //
  // primChildren
  //
  if (prim.children().size()) {
    if (require_newline) {
      ss << "\n";
      require_newline = false;
    }
    if (prim.metas().primChildren.size() == prim.children().size()) {
      // Use primChildren info to determine the order of the traversal.

      std::map<std::string, const Prim *> primNameTable;
      for (size_t i = 0; i < prim.children().size(); i++) {
        primNameTable.emplace(prim.children()[i].element_name(),
                              &prim.children()[i]);
      }

      for (size_t i = 0; i < prim.metas().primChildren.size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        value::token nameTok = prim.metas().primChildren[i];
        DCOUT(fmt::format("primChildren  {}/{} = {}", i,
                          prim.metas().primChildren.size(), nameTok.str()));
        const auto it = primNameTable.find(nameTok.str());
        if (it != primNameTable.end()) {
          ss << print_prim(*(it->second), indent + 1);
        } else {
          // TODO: Report warning?
        }
      }

    } else {
      for (size_t i = 0; i < prim.children().size(); i++) {
        if (i > 0) {
          ss << "\n";
        }
        ss << print_prim(prim.children()[i], indent + 1);
      }
    }
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}